

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall
libcellml::Importer::removeImportSource(Importer *this,ImportSourcePtr *importSource)

{
  bool bVar1;
  ImporterImpl *pIVar2;
  __normal_iterator<std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<libcellml::ImportSource>_*,_std::vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>_>
  local_28;
  const_iterator result;
  bool status;
  ImportSourcePtr *importSource_local;
  Importer *this_local;
  
  result._M_current._7_1_ = 0;
  pIVar2 = pFunc(this);
  local_28._M_current =
       (shared_ptr<libcellml::ImportSource> *)ImporterImpl::findImportSource(pIVar2,importSource);
  pIVar2 = pFunc(this);
  local_30._M_current =
       (shared_ptr<libcellml::ImportSource> *)
       std::
       vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
       ::end(&pIVar2->mImports);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar1) {
    pIVar2 = pFunc(this);
    std::
    vector<std::shared_ptr<libcellml::ImportSource>,_std::allocator<std::shared_ptr<libcellml::ImportSource>_>_>
    ::erase(&pIVar2->mImports,(const_iterator)local_28._M_current);
    result._M_current._7_1_ = 1;
  }
  return (bool)(result._M_current._7_1_ & 1);
}

Assistant:

bool Importer::removeImportSource(const ImportSourcePtr &importSource)
{
    bool status = false;
    auto result = pFunc()->findImportSource(importSource);
    if (result != pFunc()->mImports.end()) {
        pFunc()->mImports.erase(result);
        status = true;
    }
    return status;
}